

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void expr_simple(LexState *ls,ExpDesc *v)

{
  int iVar1;
  FuncState *fs_00;
  ExpKind EVar2;
  uint32_t uVar3;
  BCPos BVar4;
  BCReg base;
  FuncState *fs;
  ExpDesc *v_local;
  LexState *ls_local;
  
  iVar1 = ls->tok;
  if (iVar1 == 0x7b) {
    expr_table(ls,v);
  }
  else {
    if (iVar1 == 0x107) {
      v->k = VKFALSE;
      (v->u).s.info = 0;
      v->t = 0xffffffff;
      v->f = 0xffffffff;
    }
    else {
      if (iVar1 == 0x109) {
        lj_lex_next(ls);
        parse_body(ls,v,0,ls->linenumber);
        return;
      }
      if (iVar1 == 0x10e) {
        v->k = VKNIL;
        (v->u).s.info = 0;
        v->t = 0xffffffff;
        v->f = 0xffffffff;
      }
      else if (iVar1 == 0x114) {
        v->k = VKTRUE;
        (v->u).s.info = 0;
        v->t = 0xffffffff;
        v->f = 0xffffffff;
      }
      else if (iVar1 == 0x118) {
        fs_00 = ls->fs;
        if ((fs_00->flags & 2) == 0) {
          err_syntax(ls,LJ_ERR_XDOTS);
        }
        bcreg_reserve(fs_00,1);
        uVar3 = fs_00->freereg - 1;
        BVar4 = bcemit_INS(fs_00,uVar3 * 0x100 | 0x2000047 | (uint)fs_00->numparams << 0x10);
        v->k = VCALL;
        (v->u).s.info = BVar4;
        v->t = 0xffffffff;
        v->f = 0xffffffff;
        (v->u).s.aux = uVar3;
      }
      else if (iVar1 == 0x11e) {
        EVar2 = VKLAST;
        if ((int)(ls->tokval).field_4.it >> 0xf == -0xb) {
          EVar2 = VKCDATA;
        }
        v->k = EVar2;
        (v->u).s.info = 0;
        v->t = 0xffffffff;
        v->f = 0xffffffff;
        v->u = (anon_union_8_3_2ce71dea_for_u)ls->tokval;
      }
      else {
        if (iVar1 != 0x120) {
          expr_primary(ls,v);
          return;
        }
        v->k = VKSTR;
        (v->u).s.info = 0;
        v->t = 0xffffffff;
        v->f = 0xffffffff;
        (v->u).sval = (GCstr *)((ls->tokval).u64 & 0x7fffffffffff);
      }
    }
    lj_lex_next(ls);
  }
  return;
}

Assistant:

static void expr_simple(LexState *ls, ExpDesc *v)
{
  switch (ls->tok) {
  case TK_number:
    expr_init(v, (LJ_HASFFI && tviscdata(&ls->tokval)) ? VKCDATA : VKNUM, 0);
    copyTV(ls->L, &v->u.nval, &ls->tokval);
    break;
  case TK_string:
    expr_init(v, VKSTR, 0);
    v->u.sval = strV(&ls->tokval);
    break;
  case TK_nil:
    expr_init(v, VKNIL, 0);
    break;
  case TK_true:
    expr_init(v, VKTRUE, 0);
    break;
  case TK_false:
    expr_init(v, VKFALSE, 0);
    break;
  case TK_dots: {  /* Vararg. */
    FuncState *fs = ls->fs;
    BCReg base;
    checkcond(ls, fs->flags & PROTO_VARARG, LJ_ERR_XDOTS);
    bcreg_reserve(fs, 1);
    base = fs->freereg-1;
    expr_init(v, VCALL, bcemit_ABC(fs, BC_VARG, base, 2, fs->numparams));
    v->u.s.aux = base;
    break;
  }
  case '{':  /* Table constructor. */
    expr_table(ls, v);
    return;
  case TK_function:
    lj_lex_next(ls);
    parse_body(ls, v, 0, ls->linenumber);
    return;
  default:
    expr_primary(ls, v);
    return;
  }
  lj_lex_next(ls);
}